

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O1

ion_status_t linear_hash_update(ion_key_t key,ion_value_t value,linear_hash_table_t *linear_hash)

{
  ion_key_size_t iVar1;
  ion_dictionary_compare_t p_Var2;
  long lVar3;
  long lVar4;
  undefined8 bucket_loc;
  byte bVar5;
  char cVar6;
  int iVar7;
  ion_status_t iVar8;
  ion_byte_t *status;
  ulong uVar9;
  ion_fpos_t bucket_loc_00;
  long loc;
  ion_byte_t *key_00;
  ion_byte_t *value_00;
  ion_byte_t aiStack_80 [16];
  undefined1 local_70 [8];
  linear_hash_bucket_t bucket;
  ulong local_40;
  ion_byte_t local_31 [8];
  ion_byte_t record_status;
  
  aiStack_80[0] = 0xed;
  aiStack_80[1] = 'W';
  aiStack_80[2] = '\x11';
  aiStack_80[3] = '\0';
  aiStack_80[4] = '\0';
  aiStack_80[5] = '\0';
  aiStack_80[6] = '\0';
  aiStack_80[7] = '\0';
  iVar7 = insert_hash_to_bucket((ion_byte_t *)key,linear_hash);
  if (iVar7 < linear_hash->next_split) {
    aiStack_80[0] = 0xfe;
    aiStack_80[1] = 'W';
    aiStack_80[2] = '\x11';
    aiStack_80[3] = '\0';
    aiStack_80[4] = '\0';
    aiStack_80[5] = '\0';
    aiStack_80[6] = '\0';
    aiStack_80[7] = '\0';
    iVar7 = hash_to_bucket((ion_byte_t *)key,linear_hash);
  }
  bucket_loc_00 = -1;
  if (iVar7 < linear_hash->bucket_map->current_size) {
    bucket_loc_00 = linear_hash->bucket_map->data[iVar7];
  }
  builtin_memcpy(aiStack_80,"&X\x11",4);
  aiStack_80[4] = '\0';
  aiStack_80[5] = '\0';
  aiStack_80[6] = '\0';
  aiStack_80[7] = '\0';
  bVar5 = linear_hash_get_bucket(bucket_loc_00,(linear_hash_bucket_t *)local_70,linear_hash);
  if (bVar5 == 0) {
    lVar4 = 8 - ((long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0);
    key_00 = aiStack_80 + lVar4;
    lVar3 = -((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0);
    value_00 = key_00 + lVar3;
    local_31[0] = '\0';
    status = (ion_byte_t *)0x0;
    local_40 = 0;
    do {
      bucket.overflow_location = (ion_fpos_t)status;
      if (0 < linear_hash->records_per_bucket) {
        loc = bucket_loc_00 + 0x10;
        iVar7 = 0;
        do {
          status = local_31;
          value_00[-8] = 0x96;
          value_00[-7] = 'X';
          value_00[-6] = '\x11';
          value_00[-5] = '\0';
          value_00[-4] = '\0';
          value_00[-3] = '\0';
          value_00[-2] = '\0';
          value_00[-1] = '\0';
          iVar8.error = linear_hash_get_record(loc,key_00,value_00,status,linear_hash);
          iVar8._1_7_ = 0;
          if (iVar8.error != 0) goto LAB_00115925;
          if (local_31[0] == '\x01') {
            iVar1 = (linear_hash->super).record.key_size;
            p_Var2 = (linear_hash->super).compare;
            value_00[-8] = 0xb1;
            value_00[-7] = 'X';
            value_00[-6] = '\x11';
            value_00[-5] = '\0';
            value_00[-4] = '\0';
            value_00[-3] = '\0';
            value_00[-2] = '\0';
            value_00[-1] = '\0';
            cVar6 = (*p_Var2)(key_00,key,iVar1);
            if (cVar6 == '\0') {
              status = local_31;
              value_00[-8] = 0xcb;
              value_00[-7] = 'X';
              value_00[-6] = '\x11';
              value_00[-5] = '\0';
              value_00[-4] = '\0';
              value_00[-3] = '\0';
              value_00[-2] = '\0';
              value_00[-1] = '\0';
              iVar8.error = linear_hash_write_record
                                      (loc,key_00,(ion_byte_t *)value,status,linear_hash);
              iVar8._1_7_ = 0;
              if (iVar8.error != 0) goto LAB_00115925;
              local_40 = (ulong)((int)local_40 + 1);
            }
          }
          loc = loc + linear_hash->record_total_size;
          iVar7 = iVar7 + 1;
        } while (iVar7 < linear_hash->records_per_bucket);
      }
      bucket_loc = bucket._0_8_;
      if (bucket._0_8_ == -1) {
        status = (ion_byte_t *)CONCAT71((int7)((ulong)status >> 8),1);
      }
      else {
        value_00[-8] = 0xff;
        value_00[-7] = 'X';
        value_00[-6] = '\x11';
        value_00[-5] = '\0';
        value_00[-4] = '\0';
        value_00[-3] = '\0';
        value_00[-2] = '\0';
        value_00[-1] = '\0';
        iVar8.error = linear_hash_get_bucket
                                (bucket_loc,(linear_hash_bucket_t *)local_70,linear_hash);
        iVar8._1_7_ = 0;
        status = (ion_byte_t *)bucket.overflow_location;
        bucket_loc_00 = bucket_loc;
        if (iVar8.error != 0) {
LAB_00115925:
          uVar9 = 0;
          goto LAB_0011592b;
        }
      }
    } while ((char)status == '\0');
    if ((int)local_40 == 0) {
      builtin_memcpy(aiStack_80 + lVar3 + lVar4 + -8,"VY\x11",4);
      value_00[-4] = '\0';
      value_00[-3] = '\0';
      value_00[-2] = '\0';
      value_00[-1] = '\0';
      iVar7 = insert_hash_to_bucket((ion_byte_t *)key,linear_hash);
      builtin_memcpy(aiStack_80 + lVar3 + lVar4 + -8,"gY\x11",4);
      value_00[-4] = '\0';
      value_00[-3] = '\0';
      value_00[-2] = '\0';
      value_00[-1] = '\0';
      iVar8 = linear_hash_insert(key,value,iVar7,linear_hash);
      local_40 = (ulong)iVar8 >> 0x20;
      uVar9 = (ulong)(iVar8._0_4_ & 0xffffff00);
    }
    else {
      iVar8.error = '\0';
      iVar8._1_3_ = 0;
      iVar8.count = 0;
      uVar9 = 0;
    }
LAB_0011592b:
    bVar5 = iVar8.error;
    uVar9 = local_40 << 0x20 | uVar9;
  }
  else {
    uVar9 = 0;
  }
  return (ion_status_t)(bVar5 | uVar9);
}

Assistant:

ion_status_t
linear_hash_update(
	ion_key_t			key,
	ion_value_t			value,
	linear_hash_table_t *linear_hash
) {
	ion_status_t status = ION_STATUS_INITIALIZE;
	/* get the index of the bucket to read */
	int bucket_idx		= insert_hash_to_bucket(key, linear_hash);

	if (bucket_idx < linear_hash->next_split) {
		bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* get the bucket where the record would be located */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* create a temporary store for records that are read */
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	ion_fpos_t record_loc;

	int				i;
	ion_boolean_t	terminal = boolean_false;

	while (terminal == boolean_false) {
		record_loc = bucket_loc + sizeof(linear_hash_bucket_t);

		for (i = 0; i < linear_hash->records_per_bucket; i++) {
			status.error = linear_hash_get_record(record_loc, record_key, record_value, &record_status, linear_hash);

			if (status.error != err_ok) {
				return status;
			}

			if (record_status == linear_hash_record_status_full) {
				if (linear_hash->super.compare(record_key, key, linear_hash->super.record.key_size) == 0) {
					status.error = linear_hash_write_record(record_loc, record_key, value, &record_status, linear_hash);

					if (status.error != err_ok) {
						return status;
					}

					status.count++;
				}
			}

			record_loc += linear_hash->record_total_size;
		}

		if (bucket.overflow_location == linear_hash_end_of_list) {
			terminal = boolean_true;
		}
		else {
			bucket_loc		= bucket.overflow_location;
			status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

			if (status.error != err_ok) {
				return status;
			}
		}
	}

	if (status.count == 0) {
		status.error = err_item_not_found;
		return linear_hash_insert(key, value, insert_hash_to_bucket(key, linear_hash), linear_hash);
	}
	else {
		status.error = err_ok;
	}

	return status;
}